

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::setEBDirichlet(MLEBABecLap *this,int amrlev,MultiFab *phi,MultiFab *beta)

{
  undefined8 uVar1;
  pointer puVar2;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar3;
  long *plVar4;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  uint uVar5;
  MLEBABecLap *pMVar6;
  ulong uVar7;
  FabType FVar8;
  EBFArrayBoxFactory *this_01;
  pointer *ppbVar9;
  ulong uVar10;
  long lVar11;
  uint32_t *puVar12;
  long lVar13;
  long lVar14;
  int mglev;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Periodicity PVar20;
  int ncomp;
  int ngrow;
  MFIter mfi;
  uint local_29c;
  ulong local_298;
  MLEBABecLap *local_290;
  FabArray<amrex::EBCellFlagFab> *local_288;
  ulong local_280;
  long local_278;
  Location local_270;
  uint local_26c;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  ulong local_240;
  undefined1 local_238 [72];
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  Array4<double> local_1d8;
  FabArray<amrex::FArrayBox> *local_198;
  long local_190;
  FabArray<amrex::FArrayBox> *local_188;
  ulong local_180;
  long local_178;
  ulong local_170;
  Array4<const_double> local_168;
  Array4<const_double> local_128;
  undefined1 local_e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_d8;
  int local_c0;
  Vector<int,_std::allocator<int>_> *local_a8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_198 = &phi->super_FabArray<amrex::FArrayBox>;
  local_29c = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_26c = (beta->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  local_270 = this->m_phi_loc;
  local_290 = this;
  local_188 = &beta->super_FabArray<amrex::FArrayBox>;
  if (local_26c != local_29c && local_26c != 1) {
    Assert_host("beta_ncomp == 1 || beta_ncomp == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,0xc0,(char *)0x0);
  }
  pMVar6 = local_290;
  lVar11 = (long)amrlev;
  local_268 = lVar11;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(local_290->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    local_1d8.p._0_4_ = (uint)(local_270 == CellCentroid);
    local_e8._1_7_ = 0;
    local_e8[0] = 1;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    vStack_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)local_238,
               *(DistributionMapping **)
                &(local_290->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               *(int **)&(local_290->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar11].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ,(int *)&local_29c,(MFInfo *)&local_1d8,(FabFactory<amrex::FArrayBox> *)local_e8);
    uVar1 = local_238._0_8_;
    puVar2 = (pMVar6->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_238._0_8_ = (double *)0x0;
    tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar2[lVar11]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar2[lVar11]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)uVar1;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    if ((double *)local_238._0_8_ != (double *)0x0) {
      (**(code **)((long)*(double *)local_238._0_8_ + 8))();
    }
    local_238._0_8_ = (MultiFab *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_d8);
  }
  lVar11 = local_268;
  lVar15 = local_268 * 0x18;
  if (**(long **)&(local_290->m_eb_b_coeffs).
                  super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_268].
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      == 0) {
    lVar14 = 0;
    lVar17 = 0;
    for (lVar13 = 0; pMVar6 = local_290,
        lVar13 < (local_290->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_268]; lVar13 = lVar13 + 1) {
      local_1d8.p._0_4_ = 0;
      local_e8._1_7_ = 0;
      local_e8[0] = 1;
      vStack_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      vStack_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)local_238,
                 (DistributionMapping *)
                 (*(long *)&(local_290->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids
                            .
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar11].
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> +
                 lVar17),(int *)(*(long *)&(local_290->super_MLCellABecLap).super_MLCellLinOp.
                                           super_MLLinOp.m_dmap.
                                           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                           .
                                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                + lVar14),(int *)&local_29c,(MFInfo *)&local_1d8,
                 (FabFactory<amrex::FArrayBox> *)local_e8);
      uVar1 = local_238._0_8_;
      lVar16 = *(long *)&(pMVar6->m_eb_b_coeffs).
                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar11].
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ;
      local_238._0_8_ = (double *)0x0;
      plVar4 = *(long **)(lVar16 + lVar13 * 8);
      *(undefined8 *)(lVar16 + lVar13 * 8) = uVar1;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      if ((double *)local_238._0_8_ != (double *)0x0) {
        (**(code **)((long)*(double *)local_238._0_8_ + 8))();
      }
      local_238._0_8_ = (MultiFab *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_d8);
      lVar17 = lVar17 + 0x68;
      lVar14 = lVar14 + 0x10;
    }
  }
  lVar11 = **(long **)&(local_290->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar11].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  local_190 = lVar15;
  if (lVar11 == 0) {
    local_288 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_288 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar11,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    if (this_01 != (EBFArrayBoxFactory *)0x0) {
      local_288 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    }
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_007d7ef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_e8,&local_198->super_FabArrayBase,&local_44);
  local_180 = 0;
  if (0 < (int)local_26c) {
    local_180 = (ulong)local_26c;
  }
  do {
    if (local_c0 <=
        (int)vStack_d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      MFIter::~MFIter((MFIter *)local_e8);
      if (local_270 == CellCentroid) {
        this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (local_290->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_268]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        PVar20 = Geometry::periodicity
                           (*(Geometry **)
                             ((long)&(((local_290->super_MLCellABecLap).super_MLCellLinOp.
                                       super_MLLinOp.m_geom.
                                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ).
                                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_190));
        local_e8[0] = (undefined1)PVar20.period.vect[0];
        local_e8._1_7_ = PVar20.period.vect._1_7_;
        local_e8._8_4_ = PVar20.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (Periodicity *)local_e8,false);
      }
      return;
    }
    MFIter::tilebox((Box *)(local_238 + 0x44),(MFIter *)local_e8);
    pMVar6 = local_290;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_238,
               (FabArray<amrex::FArrayBox> *)
               (local_290->m_eb_phi).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_268]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
               (MFIter *)local_e8);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_1d8,
               (FabArray<amrex::FArrayBox> *)
               **(undefined8 **)
                 ((long)&(((pMVar6->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_190),(MFIter *)local_e8);
    if (local_288 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_00662cde:
      local_260 = (long)local_1f0;
      local_178 = (long)local_1ec;
      local_258 = CONCAT44(local_258._4_4_,local_1e0);
      uVar5 = local_29c;
      if ((int)local_29c < 1) {
        uVar5 = 0;
      }
      local_170 = (ulong)uVar5;
      local_240 = (long)(int)local_238._68_4_ * 8;
      local_298 = 0;
      uVar7 = 0;
      while (uVar10 = uVar7, lVar11 = local_178, uVar10 != local_170) {
        while (lVar15 = lVar11, (int)lVar15 <= local_1e0) {
          local_248 = (long)(int)local_238._36_4_;
          local_250 = (long)(int)local_238._40_4_;
          lVar13 = local_1d8.nstride * local_298 +
                   (local_260 - local_1d8.begin.y) * local_1d8.jstride * 8 +
                   (lVar15 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                   (long)local_1d8.begin.x * -8 +
                   CONCAT44(local_1d8.p._4_4_,(uint)local_1d8.p) + local_240;
          lVar14 = local_238._0_8_ +
                   local_238._24_8_ * local_298 +
                   (local_260 - local_248) * local_238._8_8_ * 8 +
                   (lVar15 - local_250) * local_238._16_8_ * 8 + (long)(int)local_238._32_4_ * -8 +
                   local_240;
          for (lVar11 = local_260; lVar11 <= local_1e4; lVar11 = lVar11 + 1) {
            if ((int)local_238._68_4_ <= local_1e8) {
              lVar17 = 0;
              do {
                *(undefined8 *)(lVar14 + lVar17 * 8) = 0;
                *(undefined8 *)(lVar13 + lVar17 * 8) = 0;
                lVar17 = lVar17 + 1;
              } while ((local_1e8 - local_238._68_4_) + 1 != (int)lVar17);
            }
            lVar13 = lVar13 + local_1d8.jstride * 8;
            lVar14 = lVar14 + local_238._8_8_ * 8;
          }
          local_278 = lVar15;
          lVar11 = lVar15 + 1;
        }
        local_298 = local_298 + 8;
        local_280 = uVar10;
        uVar7 = uVar10 + 1;
      }
    }
    else {
      ppbVar9 = &vStack_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar9 = (pointer *)
                  ((local_a8->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)vStack_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      FVar8 = EBCellFlagFab::getType
                        ((local_288->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar9],
                         (Box *)(local_238 + 0x44));
      if ((uint)(FVar8 + singlevalued) < 2) goto LAB_00662cde;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_168,local_198,(MFIter *)local_e8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_128,local_188,(MFIter *)local_e8);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_88,local_288,(MFIter *)local_e8);
      local_248 = (long)(int)local_238._68_4_;
      local_258 = (long)local_1f0;
      local_260 = (long)local_1ec;
      local_250 = CONCAT44(local_250._4_4_,local_1e0);
      local_278 = CONCAT44(local_278._4_4_,local_1e8);
      if (local_26c == local_29c) {
        lVar11 = local_248 * 8;
        local_298 = local_248 * 4;
        lVar15 = 0;
        uVar7 = 0;
        while (uVar10 = uVar7, lVar13 = local_260, uVar10 != local_180) {
          for (; (int)lVar13 <= local_1e0; lVar13 = lVar13 + 1) {
            puVar12 = (uint32_t *)
                      ((long)&local_88.p
                              [local_248 +
                               ((lVar13 - local_88.begin.z) * local_88.kstride -
                               (long)local_88.begin.x)].flag +
                      (local_258 - local_88.begin.y) * local_88.jstride * 4);
            for (lVar14 = local_258; lVar14 <= local_1e4; lVar14 = lVar14 + 1) {
              if ((int)local_238._68_4_ <= local_1e8) {
                lVar17 = local_238._24_8_ * lVar15 +
                         (lVar14 - (int)local_238._36_4_) * local_238._8_8_ * 8 +
                         (lVar13 - (int)local_238._40_4_) * local_238._16_8_ * 8 +
                         (long)(int)local_238._32_4_ * -8 + lVar11;
                lVar16 = 0;
                do {
                  if ((puVar12[lVar16] & 3) == 1) {
                    *(undefined8 *)(local_238._0_8_ + lVar16 * 8 + lVar17) =
                         *(undefined8 *)
                          ((long)local_168.p +
                          lVar16 * 8 +
                          local_168.nstride * lVar15 +
                          (lVar14 - local_168.begin.y) * local_168.jstride * 8 +
                          (lVar13 - local_168.begin.z) * local_168.kstride * 8 +
                          (long)local_168.begin.x * -8 + lVar11);
                    uVar1 = *(undefined8 *)
                             ((long)local_128.p +
                             lVar16 * 8 +
                             local_128.nstride * lVar15 +
                             (lVar14 - local_128.begin.y) * local_128.jstride * 8 +
                             (lVar13 - local_128.begin.z) * local_128.kstride * 8 +
                             (long)local_128.begin.x * -8 + lVar11);
                    uVar18 = (undefined4)uVar1;
                    uVar19 = (undefined4)((ulong)uVar1 >> 0x20);
                  }
                  else {
                    *(undefined8 *)(local_238._0_8_ + lVar16 * 8 + lVar17) = 0;
                    uVar18 = 0;
                    uVar19 = 0;
                  }
                  *(ulong *)(local_1d8.nstride * lVar15 +
                             (lVar14 - local_1d8.begin.y) * local_1d8.jstride * 8 +
                             (lVar13 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                             (long)local_1d8.begin.x * -8 +
                             CONCAT44(local_1d8.p._4_4_,(uint)local_1d8.p) + lVar11 + lVar16 * 8) =
                       CONCAT44(uVar19,uVar18);
                  lVar16 = lVar16 + 1;
                } while ((local_1e8 - local_238._68_4_) + 1 != (int)lVar16);
              }
              puVar12 = puVar12 + local_88.jstride;
            }
          }
          lVar15 = lVar15 + 8;
          local_280 = uVar10;
          uVar7 = uVar10 + 1;
        }
      }
      else {
        uVar5 = local_29c;
        if ((int)local_29c < 1) {
          uVar5 = 0;
        }
        local_240 = (ulong)uVar5;
        lVar11 = local_248 * 8;
        local_280 = local_248 * 4;
        lVar15 = 0;
        uVar7 = 0;
        while (uVar10 = uVar7, lVar13 = local_260, uVar10 != local_240) {
          for (; (int)lVar13 <= local_1e0; lVar13 = lVar13 + 1) {
            puVar12 = (uint32_t *)
                      ((long)&local_88.p
                              [local_248 +
                               ((lVar13 - local_88.begin.z) * local_88.kstride -
                               (long)local_88.begin.x)].flag +
                      (local_258 - local_88.begin.y) * local_88.jstride * 4);
            for (lVar14 = local_258; lVar14 <= local_1e4; lVar14 = lVar14 + 1) {
              if ((int)local_238._68_4_ <= local_1e8) {
                lVar17 = local_238._24_8_ * lVar15 +
                         (lVar14 - (int)local_238._36_4_) * local_238._8_8_ * 8 +
                         (lVar13 - (int)local_238._40_4_) * local_238._16_8_ * 8 +
                         (long)(int)local_238._32_4_ * -8 + lVar11;
                lVar16 = 0;
                do {
                  if ((puVar12[lVar16] & 3) == 1) {
                    *(undefined8 *)(local_238._0_8_ + lVar16 * 8 + lVar17) =
                         *(undefined8 *)
                          ((long)local_168.p +
                          lVar16 * 8 +
                          local_168.nstride * lVar15 +
                          (lVar14 - local_168.begin.y) * local_168.jstride * 8 +
                          (lVar13 - local_168.begin.z) * local_168.kstride * 8 +
                          (long)local_168.begin.x * -8 + lVar11);
                    uVar18 = SUB84(local_128.p
                                   [local_248 +
                                    (((lVar13 - local_128.begin.z) * local_128.kstride +
                                     (lVar14 - local_128.begin.y) * local_128.jstride + lVar16) -
                                    (long)local_128.begin.x)],0);
                    uVar19 = (undefined4)
                             ((ulong)local_128.p
                                     [local_248 +
                                      (((lVar13 - local_128.begin.z) * local_128.kstride +
                                       (lVar14 - local_128.begin.y) * local_128.jstride + lVar16) -
                                      (long)local_128.begin.x)] >> 0x20);
                  }
                  else {
                    *(undefined8 *)(local_238._0_8_ + lVar16 * 8 + lVar17) = 0;
                    uVar18 = 0;
                    uVar19 = 0;
                  }
                  *(ulong *)(local_1d8.nstride * lVar15 +
                             (lVar14 - local_1d8.begin.y) * local_1d8.jstride * 8 +
                             (lVar13 - local_1d8.begin.z) * local_1d8.kstride * 8 +
                             (long)local_1d8.begin.x * -8 +
                             CONCAT44(local_1d8.p._4_4_,(uint)local_1d8.p) + lVar11 + lVar16 * 8) =
                       CONCAT44(uVar19,uVar18);
                  lVar16 = lVar16 + 1;
                } while ((local_1e8 - local_238._68_4_) + 1 != (int)lVar16);
              }
              puVar12 = puVar12 + local_88.jstride;
            }
          }
          lVar15 = lVar15 + 8;
          local_298 = uVar10;
          uVar7 = uVar10 + 1;
        }
      }
    }
    MFIter::operator++((MFIter *)local_e8);
  } while( true );
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, const MultiFab& beta)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta.nComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);

    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            Array4<Real const> const& betain = beta.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            if (beta_ncomp == ncomp) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        phiout(i,j,k,n) = phiin(i,j,k,n);
                        betaout(i,j,k,n) = betain(i,j,k,n);
                    } else {
                        phiout(i,j,k,n) = 0.0;
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        phiout(i,j,k,n) = phiin(i,j,k,n);
                        betaout(i,j,k,n) = betain(i,j,k,0);
                    } else {
                        phiout(i,j,k,n) = 0.0;
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            }
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}